

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcBmcAnd.c
# Opt level: O1

Gia_Man_t * Gia_ManBmcDupCone(Gia_Man_t *p,Vec_Int_t *vIns,Vec_Int_t *vNodes,Vec_Int_t *vOuts)

{
  int iVar1;
  Vec_Int_t *p_00;
  int *piVar2;
  Vec_Int_t *p_01;
  Gia_Man_t *pGVar3;
  int iVar4;
  long lVar5;
  
  iVar1 = vIns->nSize;
  p_00 = (Vec_Int_t *)malloc(0x10);
  iVar4 = 0x10;
  if (0xe < iVar1 - 1U) {
    iVar4 = iVar1;
  }
  p_00->nSize = 0;
  p_00->nCap = iVar4;
  if (iVar4 == 0) {
    piVar2 = (int *)0x0;
  }
  else {
    piVar2 = (int *)malloc((long)iVar4 << 2);
  }
  p_00->pArray = piVar2;
  if (0 < vIns->nSize) {
    lVar5 = 0;
    do {
      iVar1 = vIns->pArray[lVar5];
      if (((long)iVar1 < 0) || (p->nObjs <= iVar1)) goto LAB_00565565;
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      Vec_IntPush(p_00,p->pObjs[iVar1].Value);
      lVar5 = lVar5 + 1;
    } while (lVar5 < vIns->nSize);
  }
  iVar1 = vNodes->nSize;
  p_01 = (Vec_Int_t *)malloc(0x10);
  iVar4 = 0x10;
  if (0xe < iVar1 - 1U) {
    iVar4 = iVar1;
  }
  p_01->nSize = 0;
  p_01->nCap = iVar4;
  if (iVar4 == 0) {
    piVar2 = (int *)0x0;
  }
  else {
    piVar2 = (int *)malloc((long)iVar4 << 2);
  }
  p_01->pArray = piVar2;
  if (0 < vNodes->nSize) {
    lVar5 = 0;
    do {
      iVar1 = vNodes->pArray[lVar5];
      if (((long)iVar1 < 0) || (p->nObjs <= iVar1)) goto LAB_00565565;
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      Vec_IntPush(p_01,p->pObjs[iVar1].Value);
      lVar5 = lVar5 + 1;
    } while (lVar5 < vNodes->nSize);
  }
  pGVar3 = Gia_ManDupFromVecs(p,vIns,vNodes,vOuts,0);
  iVar1 = vIns->nSize;
  if (0 < (long)iVar1) {
    piVar2 = vIns->pArray;
    lVar5 = 0;
    do {
      iVar4 = piVar2[lVar5];
      if (((long)iVar4 < 0) || (p->nObjs <= iVar4)) goto LAB_00565565;
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      if (p_00->nSize <= lVar5) goto LAB_00565584;
      p->pObjs[iVar4].Value = p_00->pArray[lVar5];
      lVar5 = lVar5 + 1;
    } while (iVar1 != lVar5);
  }
  iVar1 = vNodes->nSize;
  if (0 < (long)iVar1) {
    piVar2 = vNodes->pArray;
    lVar5 = 0;
    do {
      iVar4 = piVar2[lVar5];
      if (((long)iVar4 < 0) || (p->nObjs <= iVar4)) goto LAB_00565565;
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      if (p_01->nSize <= lVar5) {
LAB_00565584:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      p->pObjs[iVar4].Value = p_01->pArray[lVar5];
      lVar5 = lVar5 + 1;
    } while (iVar1 != lVar5);
  }
  iVar1 = vOuts->nSize;
  if (0 < (long)iVar1) {
    piVar2 = vOuts->pArray;
    lVar5 = 0;
    do {
      iVar4 = piVar2[lVar5];
      if (((long)iVar4 < 0) || (p->nObjs <= iVar4)) {
LAB_00565565:
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      p->pObjs[iVar4].Value = 0;
      lVar5 = lVar5 + 1;
    } while (iVar1 != lVar5);
  }
  if (p_00->pArray != (int *)0x0) {
    free(p_00->pArray);
    p_00->pArray = (int *)0x0;
  }
  free(p_00);
  if (p_01->pArray != (int *)0x0) {
    free(p_01->pArray);
    p_01->pArray = (int *)0x0;
  }
  free(p_01);
  return pGVar3;
}

Assistant:

Gia_Man_t * Gia_ManBmcDupCone( Gia_Man_t * p, Vec_Int_t * vIns, Vec_Int_t * vNodes, Vec_Int_t * vOuts )
{
    Gia_Man_t * pNew;
    Vec_Int_t * vTempIn, * vTempNode;
    Gia_Obj_t * pObj;
    int i;
    // save values
    vTempIn = Vec_IntAlloc( Vec_IntSize(vIns) );
    Gia_ManForEachObjVec( vIns, p, pObj, i )
        Vec_IntPush( vTempIn, pObj->Value );
    // save values
    vTempNode = Vec_IntAlloc( Vec_IntSize(vNodes) );
    Gia_ManForEachObjVec( vNodes, p, pObj, i )
        Vec_IntPush( vTempNode, pObj->Value );
    // derive new GIA
    pNew = Gia_ManDupFromVecs( p, vIns, vNodes, vOuts, 0 );
    // reset values
    Gia_ManForEachObjVec( vIns, p, pObj, i )
        pObj->Value = Vec_IntEntry( vTempIn, i );
    // reset values
    Gia_ManForEachObjVec( vNodes, p, pObj, i )
        pObj->Value = Vec_IntEntry( vTempNode, i );
    // reset values
    Gia_ManForEachObjVec( vOuts, p, pObj, i )
        pObj->Value = 0;
    Vec_IntFree( vTempIn );
    Vec_IntFree( vTempNode );
    return pNew;
}